

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O0

void __thiscall Session::MainPoint(Session *this)

{
  bool bVar1;
  ostream *poVar2;
  allocator local_31;
  string local_30 [8];
  string command;
  Session *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,0x14,'\0',&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  while (bVar1 = IsOpened(this), bVar1) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&std::cin,local_30);
    bVar1 = Handler::RunCommand(&this->m_Handler,(string *)local_30);
    if (!bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Command: ");
      poVar2 = std::operator<<(poVar2,local_30);
      poVar2 = std::operator<<(poVar2," doesn\'t exists");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
  }
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void Session::MainPoint() {
    std::string command(20, '\0');
    while (IsOpened()) {
        std::getline(std::cin, command);
        if(!m_Handler.RunCommand(command)) {
            std::cout << "Command: " << command << " doesn't exists" << std::endl;
        }
    }
}